

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O1

void luaD_throw(lua_State *L,int errcode)

{
  lua_State *plVar1;
  lua_CFunction p_Var2;
  StkId pTVar3;
  StkId pTVar4;
  undefined8 *puVar5;
  
  if (L->errorJmp != (lua_longjmp *)0x0) {
    L->errorJmp->status = errcode;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = L->errorJmp;
    __cxa_throw(puVar5,&lua_longjmp*::typeinfo,0);
  }
  L->status = (lu_byte)errcode;
  plVar1 = L->l_G->mainthread;
  if (plVar1->errorJmp == (lua_longjmp *)0x0) {
    p_Var2 = L->l_G->panic;
    if (p_Var2 != (lua_CFunction)0x0) {
      (*p_Var2)(L);
    }
    abort();
  }
  pTVar3 = L->top;
  pTVar4 = plVar1->top;
  plVar1->top = pTVar4 + 1;
  pTVar4->value_ = pTVar3[-1].value_;
  pTVar4->tt_ = pTVar3[-1].tt_;
  luaD_throw(L->l_G->mainthread,errcode);
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    L->status = cast_byte(errcode);  /* mark it as dead */
    if (G(L)->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, G(L)->mainthread->top++, L->top - 1);  /* copy error obj. */
      luaD_throw(G(L)->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (G(L)->panic) {  /* panic function? */
        lua_unlock(L);
        G(L)->panic(L);  /* call it (last chance to jump out) */
      }
      abort();
    }
  }
}